

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

vm_obj_id_t __thiscall
CVmObjTable::alloc_obj(CVmObjTable *this,int in_root_set,int can_have_refs,int can_have_weak_refs)

{
  CVmObjPageEntry *entry;
  uint uVar1;
  CVmObjPageEntry *pCVar2;
  vm_obj_id_t id;
  
  alloc_check_gc(this,1);
  id = this->first_free_;
  if (id == 0) {
    alloc_new_page(this);
    id = this->first_free_;
  }
  pCVar2 = this->pages_[id >> 0xc];
  entry = pCVar2 + (id & 0xfff);
  uVar1 = pCVar2[id & 0xfff].next_obj_;
  this->first_free_ = uVar1;
  if (uVar1 != 0) {
    this->pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_.prev_free_ = (entry->ptr_).prev_free_;
  }
  init_entry_for_alloc(this,id,entry,in_root_set,can_have_refs,can_have_weak_refs);
  return id;
}

Assistant:

vm_obj_id_t CVmObjTable::alloc_obj(VMG_ int in_root_set,
                                   int can_have_refs, int can_have_weak_refs)
{
    /* count the allocation and maybe perform garbage collection */
    alloc_check_gc(vmg_ TRUE);

    /* if the free list is empty, allocate a new page of object entries */
    if (first_free_ == VM_INVALID_OBJ)
        alloc_new_page();
        
    /* remember the first item in the free list - this is our result */
    vm_obj_id_t ret = first_free_;
    
    /* get the object table entry for the ID */
    CVmObjPageEntry *entry = get_entry(ret);

    /* unlink new entry from the free list */
    first_free_ = entry->next_obj_;
    if (entry->next_obj_ != VM_INVALID_OBJ)
        get_entry(entry->next_obj_)->ptr_.prev_free_ = entry->ptr_.prev_free_;

    /* initialize the entry */
    init_entry_for_alloc(ret, entry, in_root_set,
                         can_have_refs, can_have_weak_refs);

    /* return the free object */
    return ret;
}